

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvSensAllocVectors(CVodeMem cv_mem,N_Vector tmpl)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 in_RSI;
  long in_RDI;
  int j;
  int i;
  int local_20;
  int local_1c;
  int local_4;
  
  uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0x90),in_RSI);
  *(undefined8 *)(in_RDI + 0x2f8) = uVar1;
  if (*(long *)(in_RDI + 0x2f8) == 0) {
    local_4 = 0;
  }
  else {
    uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0x90),in_RSI);
    *(undefined8 *)(in_RDI + 0x2f0) = uVar1;
    if (*(long *)(in_RDI + 0x2f0) == 0) {
      N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f8),*(undefined4 *)(in_RDI + 0x90));
      local_4 = 0;
    }
    else {
      uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0x90),in_RSI);
      *(undefined8 *)(in_RDI + 0x300) = uVar1;
      if (*(long *)(in_RDI + 0x300) == 0) {
        N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f8),*(undefined4 *)(in_RDI + 0x90));
        N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f0),*(undefined4 *)(in_RDI + 0x90));
        local_4 = 0;
      }
      else {
        uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0x90),in_RSI);
        *(undefined8 *)(in_RDI + 0x308) = uVar1;
        if (*(long *)(in_RDI + 0x308) == 0) {
          N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f8),*(undefined4 *)(in_RDI + 0x90));
          N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f0),*(undefined4 *)(in_RDI + 0x90));
          N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x300),*(undefined4 *)(in_RDI + 0x90));
          local_4 = 0;
        }
        else {
          uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0x90),in_RSI);
          *(undefined8 *)(in_RDI + 0x310) = uVar1;
          if (*(long *)(in_RDI + 0x310) == 0) {
            N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f8),*(undefined4 *)(in_RDI + 0x90));
            N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f0),*(undefined4 *)(in_RDI + 0x90));
            N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x300),*(undefined4 *)(in_RDI + 0x90));
            N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x308),*(undefined4 *)(in_RDI + 0x90));
            local_4 = 0;
          }
          else {
            for (local_20 = 0; local_20 <= *(int *)(in_RDI + 0x598); local_20 = local_20 + 1) {
              uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0x90),in_RSI);
              *(undefined8 *)(in_RDI + 0x288 + (long)local_20 * 8) = uVar1;
              if (*(long *)(in_RDI + 0x288 + (long)local_20 * 8) == 0) {
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x2f8),*(undefined4 *)(in_RDI + 0x90));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x2f0),*(undefined4 *)(in_RDI + 0x90));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x300),*(undefined4 *)(in_RDI + 0x90));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x308),*(undefined4 *)(in_RDI + 0x90));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x310),*(undefined4 *)(in_RDI + 0x90));
                for (local_1c = 0; local_1c < local_20; local_1c = local_1c + 1) {
                  N_VDestroyVectorArray
                            (*(undefined8 *)(in_RDI + 0x288 + (long)local_1c * 8),
                             *(undefined4 *)(in_RDI + 0x90));
                }
                return 0;
              }
            }
            *(undefined8 *)(in_RDI + 0xc0) = 0;
            pvVar2 = malloc((long)*(int *)(in_RDI + 0x90) << 3);
            *(void **)(in_RDI + 0xc0) = pvVar2;
            if (*(long *)(in_RDI + 0xc0) == 0) {
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f8),*(undefined4 *)(in_RDI + 0x90));
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f0),*(undefined4 *)(in_RDI + 0x90));
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x300),*(undefined4 *)(in_RDI + 0x90));
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x308),*(undefined4 *)(in_RDI + 0x90));
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x310),*(undefined4 *)(in_RDI + 0x90));
              for (local_1c = 0; local_1c <= *(int *)(in_RDI + 0x598); local_1c = local_1c + 1) {
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x288 + (long)local_1c * 8),
                           *(undefined4 *)(in_RDI + 0x90));
              }
              local_4 = 0;
            }
            else {
              *(undefined8 *)(in_RDI + 200) = 0;
              pvVar2 = malloc((long)*(int *)(in_RDI + 0x90) << 2);
              *(void **)(in_RDI + 200) = pvVar2;
              if (*(long *)(in_RDI + 200) == 0) {
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x2f8),*(undefined4 *)(in_RDI + 0x90));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x2f0),*(undefined4 *)(in_RDI + 0x90));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x300),*(undefined4 *)(in_RDI + 0x90));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x308),*(undefined4 *)(in_RDI + 0x90));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x310),*(undefined4 *)(in_RDI + 0x90));
                for (local_1c = 0; local_1c <= *(int *)(in_RDI + 0x598); local_1c = local_1c + 1) {
                  N_VDestroyVectorArray
                            (*(undefined8 *)(in_RDI + 0x288 + (long)local_1c * 8),
                             *(undefined4 *)(in_RDI + 0x90));
                }
                free(*(void **)(in_RDI + 0xc0));
                *(undefined8 *)(in_RDI + 0xc0) = 0;
                local_4 = 0;
              }
              else {
                *(long *)(in_RDI + 0x718) =
                     (long)((*(int *)(in_RDI + 0x598) + 6) * *(int *)(in_RDI + 0x90)) *
                     *(long *)(in_RDI + 0x6f8) + (long)*(int *)(in_RDI + 0x90) +
                     *(long *)(in_RDI + 0x718);
                *(long *)(in_RDI + 0x720) =
                     (long)((*(int *)(in_RDI + 0x598) + 6) * *(int *)(in_RDI + 0x90)) *
                     *(long *)(in_RDI + 0x700) + (long)*(int *)(in_RDI + 0x90) +
                     *(long *)(in_RDI + 0x720);
                *(undefined4 *)(in_RDI + 0x838) = *(undefined4 *)(in_RDI + 0x598);
                local_4 = 1;
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static sunbooleantype cvSensAllocVectors(CVodeMem cv_mem, N_Vector tmpl)
{
  int i, j;

  /* Allocate yS */
  cv_mem->cv_yS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_yS == NULL) { return (SUNFALSE); }

  /* Allocate ewtS */
  cv_mem->cv_ewtS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_ewtS == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    return (SUNFALSE);
  }

  /* Allocate acorS */
  cv_mem->cv_acorS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_acorS == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    return (SUNFALSE);
  }

  /* Allocate tempvS */
  cv_mem->cv_tempvS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_tempvS == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
    return (SUNFALSE);
  }

  /* Allocate ftempS */
  cv_mem->cv_ftempS = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
  if (cv_mem->cv_ftempS == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
    return (SUNFALSE);
  }

  /* Allocate znS */
  for (j = 0; j <= cv_mem->cv_qmax; j++)
  {
    cv_mem->cv_znS[j] = N_VCloneVectorArray(cv_mem->cv_Ns, tmpl);
    if (cv_mem->cv_znS[j] == NULL)
    {
      N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
      N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
      N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
      N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
      N_VDestroyVectorArray(cv_mem->cv_ftempS, cv_mem->cv_Ns);
      for (i = 0; i < j; i++)
      {
        N_VDestroyVectorArray(cv_mem->cv_znS[i], cv_mem->cv_Ns);
      }
      return (SUNFALSE);
    }
  }

  /* Allocate space for pbar and plist */
  cv_mem->cv_pbar = NULL;
  cv_mem->cv_pbar = (sunrealtype*)malloc(cv_mem->cv_Ns * sizeof(sunrealtype));
  if (cv_mem->cv_pbar == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ftempS, cv_mem->cv_Ns);
    for (i = 0; i <= cv_mem->cv_qmax; i++)
    {
      N_VDestroyVectorArray(cv_mem->cv_znS[i], cv_mem->cv_Ns);
    }
    return (SUNFALSE);
  }

  cv_mem->cv_plist = NULL;
  cv_mem->cv_plist = (int*)malloc(cv_mem->cv_Ns * sizeof(int));
  if (cv_mem->cv_plist == NULL)
  {
    N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
    N_VDestroyVectorArray(cv_mem->cv_ftempS, cv_mem->cv_Ns);
    for (i = 0; i <= cv_mem->cv_qmax; i++)
    {
      N_VDestroyVectorArray(cv_mem->cv_znS[i], cv_mem->cv_Ns);
    }
    free(cv_mem->cv_pbar);
    cv_mem->cv_pbar = NULL;
    return (SUNFALSE);
  }

  /* Update solver workspace lengths */
  cv_mem->cv_lrw += (cv_mem->cv_qmax + 6) * cv_mem->cv_Ns * cv_mem->cv_lrw1 +
                    cv_mem->cv_Ns;
  cv_mem->cv_liw += (cv_mem->cv_qmax + 6) * cv_mem->cv_Ns * cv_mem->cv_liw1 +
                    cv_mem->cv_Ns;

  /* Store the value of qmax used here */
  cv_mem->cv_qmax_allocS = cv_mem->cv_qmax;

  return (SUNTRUE);
}